

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormalsUtil.h
# Opt level: O0

void MapFormalsFromPattern<ByteCodeGenerator::PopulateFormalsScope(unsigned_int,FuncInfo*,ParseNodeFnc*)::__0>
               (ParseNodeFnc *pnodeFunc,anon_class_40_5_07c1c418 fn)

{
  ParseNodePtr pPVar1;
  anon_class_40_5_07c1c418 handler;
  anon_class_40_5_07c1c418 handler_00;
  ParseNodeParamPattern *pPVar2;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  uint *local_50;
  ParseNode *local_48;
  ParseNodePtr rest;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  uint *local_20;
  ParseNode *local_18;
  ParseNode *pnode;
  ParseNodeFnc *pnodeFunc_local;
  
  local_18 = pnodeFunc->pnodeParams;
  pnode = &pnodeFunc->super_ParseNode;
  for (; local_18 != (ParseNode *)0x0; local_18 = ParseNode::GetFormalNext(local_18)) {
    if (local_18->nop == knopParamPattern) {
      pPVar2 = ParseNode::AsParseNodeParamPattern(local_18);
      pPVar1 = (pPVar2->super_ParseNodeUni).pnode1;
      memcpy(&rest,&fn,0x28);
      handler.this = (ByteCodeGenerator *)uStack_38;
      handler.debuggerScope = (DebuggerScope **)rest;
      handler.pnodeFnc = (ParseNodeFnc **)local_30;
      handler.funcInfo = (FuncInfo **)uStack_28;
      handler.beginOffset = local_20;
      Parser::
      MapBindIdentifier<ByteCodeGenerator::PopulateFormalsScope(unsigned_int,FuncInfo*,ParseNodeFnc*)::__0>
                (pPVar1,handler);
    }
  }
  local_48 = *(ParseNode **)(pnode + 6);
  if ((local_48 != (ParseNode *)0x0) && (local_48->nop == knopParamPattern)) {
    pPVar2 = ParseNode::AsParseNodeParamPattern(local_48);
    pPVar1 = (pPVar2->super_ParseNodeUni).pnode1;
    memcpy(&local_70,&fn,0x28);
    handler_00.this = (ByteCodeGenerator *)uStack_68;
    handler_00.debuggerScope = (DebuggerScope **)local_70;
    handler_00.pnodeFnc = (ParseNodeFnc **)local_60;
    handler_00.funcInfo = (FuncInfo **)uStack_58;
    handler_00.beginOffset = local_50;
    Parser::
    MapBindIdentifier<ByteCodeGenerator::PopulateFormalsScope(unsigned_int,FuncInfo*,ParseNodeFnc*)::__0>
              (pPVar1,handler_00);
  }
  return;
}

Assistant:

void MapFormalsFromPattern(ParseNodeFnc *pnodeFunc, Fn fn)
{
    for (ParseNode *pnode = pnodeFunc->pnodeParams; pnode != nullptr; pnode = pnode->GetFormalNext())
    {
        if (pnode->nop == knopParamPattern)
        {
            Parser::MapBindIdentifier(pnode->AsParseNodeParamPattern()->pnode1, fn);
        }
    }

    ParseNodePtr rest = pnodeFunc->pnodeRest;
    if (rest != nullptr && rest->nop == knopParamPattern)
    {
        Parser::MapBindIdentifier(rest->AsParseNodeParamPattern()->pnode1, fn);
    }
}